

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

ast * sibling(ast *a,int n)

{
  int iVar1;
  ast *ret;
  bool bVar2;
  
  if (n < 0) {
    if (a != (ast *)0x0) {
      iVar1 = n + 1;
      do {
        a = a->pre;
        if (iVar1 == 0) {
          return a;
        }
        iVar1 = iVar1 + 1;
      } while (a != (ast *)0x0);
    }
  }
  else if (a != (ast *)0x0 && n != 0) {
    iVar1 = n + -1;
    do {
      a = a->right;
      bVar2 = iVar1 == 0;
      iVar1 = iVar1 + -1;
      if (bVar2) {
        return a;
      }
    } while (a != (ast *)0x0);
  }
  return a;
}

Assistant:

struct ast *sibling(struct ast *a, int n) {
    struct ast *ret = a;
    if (n >= 0) {
        while (n-- && ret)
            ret = ret->right;
    }
    else {
        n = -n;
        while (n-- && ret)
            ret = ret->pre;
    }
    return ret;
}